

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_record(ModuleParseContext *this,BlockOrRecord *entry)

{
  ulong *puVar1;
  pointer ppTVar2;
  ulong uVar3;
  pointer puVar4;
  unsigned_long uVar5;
  pointer pvVar6;
  LoggingCallback p_Var7;
  void *pvVar8;
  PointerType *this_00;
  Type *pTVar9;
  ulong uVar10;
  Function *func;
  Function *local_1050;
  size_type id;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
  local_1040;
  FunctionType *func_type;
  char acStack_1020 [4088];
  
  if (this->use_strtab == true) {
    p_Var7 = dxil_spv::get_thread_log_callback();
    if (p_Var7 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Unknown module code 2 which uses strtab.\n",0x32,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(acStack_1020 + 0x18," strtab.\n",10);
      builtin_strncpy(acStack_1020 + 8,"ode 2 which uses",0x10);
      func_type = (FunctionType *)0x206e776f6e6b6e55;
      builtin_strncpy(acStack_1020,"module c",8);
      pvVar8 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var7)(pvVar8,Error,(char *)&func_type);
    }
  }
  else {
    puVar1 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0x10 < (ulong)((long)(entry->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      ppTVar2 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((*puVar1 < (ulong)((long)(this->types).
                                   super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3))
         && (pTVar9 = ppTVar2[*puVar1], pTVar9 != (Type *)0x0)) {
        uVar3 = puVar1[2];
        func_type = dyn_cast<LLVMBC::FunctionType>(pTVar9);
        if (func_type == (FunctionType *)0x0) {
          this_00 = cast<LLVMBC::PointerType>(pTVar9);
          pTVar9 = PointerType::getElementType(this_00);
          func_type = cast<LLVMBC::FunctionType>(pTVar9);
          if (func_type == (FunctionType *)0x0) {
            return false;
          }
        }
        id = (long)(this->values).
                   super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->values).
                   super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
        local_1050 = LLVMContext::
                     construct<LLVMBC::Function,LLVMBC::FunctionType*&,unsigned_long&,LLVMBC::Module&>
                               (this->context,&func_type,&id,this->module);
        puVar4 = (entry->ops).
                 super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        func = local_1050;
        if ((0x20 < (ulong)((long)(entry->ops).
                                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) &&
           (uVar5 = puVar4[4], uVar5 != 0)) {
          uVar10 = uVar5 - 1;
          pvVar6 = (this->attribute_lists).
                   super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (uVar10 < (ulong)(((long)(this->attribute_lists).
                                      super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) /
                              0x18)) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
            ::vector(&local_1040,pvVar6 + uVar10);
            Function::set_attributes(local_1050,&local_1040);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
            ::~vector(&local_1040);
          }
        }
        std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
        emplace_back<LLVMBC::Value*>
                  ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)
                   &this->values,(Value **)&local_1050);
        if (uVar3 == 0) {
          std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
          push_back(&this->functions_with_bodies,&func);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ModuleParseContext::parse_function_record(const BlockOrRecord &entry)
{
	if (use_strtab)
	{
		LOGE("Unknown module code 2 which uses strtab.\n");
		return false;
	}

	if (entry.ops.size() < 3)
		return false;

	auto *type = get_type(entry.ops[0]);
	if (!type)
		return false;

	// Calling convention is [1], not relevant.
	bool is_proto = entry.ops[2];
	// Lots of other irrelevant arguments ...

	auto *func_type = dyn_cast<FunctionType>(type);
	if (!func_type)
		func_type = cast<FunctionType>(cast<PointerType>(type)->getElementType());

	if (!func_type)
		return false;

	auto id = values.size();
	auto *func = context->construct<Function>(func_type, id, *module);

	if (entry.ops.size() >= 5 && entry.ops[4] != 0 && (entry.ops[4] - 1) < attribute_lists.size())
		func->set_attributes(attribute_lists[entry.ops[4] - 1]);

	values.push_back(func);

	if (!is_proto)
		functions_with_bodies.push_back(func);

	return true;
}